

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

char ** stb_getopt_param(int *argc,char **argv,char *param)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  char *unaff_RBP;
  int iVar5;
  uint uVar6;
  char cVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  char **opts;
  char **local_68;
  int local_5c;
  char **local_58;
  int *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_68 = (char **)0x0;
  iVar5 = *argc;
  iVar8 = 1;
  local_40 = param;
  if (1 < iVar5) {
    uVar6 = 1;
    local_58 = argv;
    local_50 = argc;
    do {
      pcVar2 = argv[(int)uVar6];
      if (*pcVar2 == '-') {
        if (pcVar2[1] == '\0') {
          if ((int)(uVar6 + 1) < iVar5) {
            lVar9 = 0;
            do {
              argv[iVar8 + lVar9] = argv[(int)(uVar6 + 1) + lVar9];
              lVar9 = lVar9 + 1;
            } while (~uVar6 + iVar5 != (int)lVar9);
            iVar8 = iVar8 + (int)lVar9;
          }
          break;
        }
        cVar7 = pcVar2[1];
        bVar10 = cVar7 == '\0';
        local_5c = iVar8;
        if (!bVar10) {
          local_48 = pcVar2 + 1;
          iVar5 = 1;
          lVar9 = 1;
          local_38 = pcVar2;
          do {
            pcVar2 = strchr(local_40,(int)cVar7);
            if (pcVar2 == (char *)0x0) {
              unaff_RBP = (char *)malloc(2);
              if (unaff_RBP != (char *)0x0) {
                *unaff_RBP = cVar7;
                unaff_RBP[1] = '\0';
                goto LAB_00187bfb;
              }
              unaff_RBP = (char *)0x0;
LAB_00187c0b:
              bVar1 = false;
            }
            else {
              if (local_48[lVar9] == '\0') {
                if (uVar6 != *local_50 - 1U) {
                  lVar9 = (long)(int)uVar6;
                  uVar6 = uVar6 + 1;
                  pcVar2 = local_58[lVar9 + 1];
                  goto LAB_00187bc3;
                }
                *local_50 = 0;
                stb_getopt_free(local_68);
LAB_00187bf5:
                bVar1 = false;
              }
              else {
                pcVar2 = local_48 + lVar9;
                sVar3 = strlen(pcVar2);
                iVar5 = iVar5 + (int)sVar3;
LAB_00187bc3:
                sVar3 = strlen(pcVar2);
                unaff_RBP = (char *)malloc((long)((int)sVar3 + 2));
                if (unaff_RBP == (char *)0x0) {
                  unaff_RBP = (char *)0x0;
                  goto LAB_00187bf5;
                }
                *unaff_RBP = cVar7;
                strcpy(unaff_RBP + 1,pcVar2);
                bVar1 = true;
              }
              if (!bVar1) goto LAB_00187c0b;
LAB_00187bfb:
              if (local_68 == (char **)0x0) {
                iVar4 = 1;
                iVar8 = 0;
              }
              else {
                iVar4 = *(int *)(local_68 + -2) + 1;
                iVar8 = *(int *)((long)local_68 + -0xc);
              }
              if (iVar8 < iVar4) {
                stb__arr_addlen_(&local_68,8,1);
              }
              else {
                *(int *)(local_68 + -2) = *(int *)(local_68 + -2) + 1;
              }
              if (local_68 == (char **)0x0) {
                lVar9 = 0;
              }
              else {
                lVar9 = (long)*(int *)(local_68 + -2);
              }
              local_68[lVar9 + -1] = unaff_RBP;
              bVar1 = true;
            }
            if (!bVar1) break;
            cVar7 = local_38[(long)iVar5 + 1];
            lVar9 = (long)iVar5 + 1;
            iVar5 = (int)lVar9;
            bVar10 = cVar7 == '\0';
          } while (!bVar10);
        }
        argc = local_50;
        argv = local_58;
        iVar8 = local_5c;
        if (!bVar10) {
          return (char **)0x0;
        }
      }
      else {
        lVar9 = (long)iVar8;
        iVar8 = iVar8 + 1;
        argv[lVar9] = pcVar2;
      }
      uVar6 = uVar6 + 1;
      iVar5 = *argc;
    } while ((int)uVar6 < iVar5);
  }
  iVar5 = 1;
  if (local_68 == (char **)0x0) {
    iVar4 = 0;
  }
  else {
    iVar5 = *(int *)(local_68 + -2) + 1;
    iVar4 = *(int *)((long)local_68 + -0xc);
  }
  if (iVar4 < iVar5) {
    stb__arr_addlen_(&local_68,8,1);
  }
  else {
    *(int *)(local_68 + -2) = *(int *)(local_68 + -2) + 1;
  }
  if (local_68 == (char **)0x0) {
    lVar9 = 0;
  }
  else {
    lVar9 = (long)*(int *)(local_68 + -2);
  }
  local_68[lVar9 + -1] = (char *)0x0;
  *argc = iVar8;
  return local_68;
}

Assistant:

char **stb_getopt_param(int *argc, char **argv, char *param)
{
   char ** opts=NULL;
   int i,j=1;
   for (i=1; i < *argc; ++i) {
      if (argv[i][0] != '-') {
         argv[j++] = argv[i];
      } else {
         if (argv[i][1] == 0) { // plain - == don't parse further options
            ++i;
            while (i < *argc)
               argv[j++] = argv[i++];
            break;
         } else {
            int k;
            char *q = argv[i];  // traverse options list
            for (k=1; q[k]; ++k) {
               char *s;
               if (strchr(param, q[k])) {  // does it take a parameter?
                  char *t = &q[k+1], z = q[k];
                  int len=0;
                  if (*t == 0) {
                     if (i == *argc-1) { // takes a parameter, but none found
                        *argc = 0;
                        stb_getopt_free(opts);
                        return NULL;
                     }
                     t = argv[++i];
                  } else
                     k += strlen(t);
                  len = strlen(t);
                  s = (char *) malloc(len+2);
                  if (!s) return NULL;
                  s[0] = z;
                  strcpy(s+1, t);
               } else {
                  // no parameter
                  s = (char *) malloc(2);
                  if (!s) return NULL;
                  s[0] = q[k];
                  s[1] = 0;
               }
               stb_arr_push(opts, s);
            }
         }
      }
   }
   stb_arr_push(opts, NULL);
   *argc = j;
   return opts;
}